

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

bool tcu::isTrilinearCompareValid
               (CompareMode compareMode,TexComparePrecision *prec,Vec4 *depths0,Vec4 *depths1,
               Vec2 *xBounds0,Vec2 *yBounds0,Vec2 *xBounds1,Vec2 *yBounds1,Vec2 *fBounds,
               float cmpReference,float result,bool isFixedPointDepth)

{
  bool isFixedPointDepth_local;
  float result_local;
  float cmpReference_local;
  Vec2 *yBounds0_local;
  Vec2 *xBounds0_local;
  Vec4 *depths1_local;
  Vec4 *depths0_local;
  TexComparePrecision *prec_local;
  CompareMode compareMode_local;
  
  if (prec->pcfBits < 1) {
    prec_local._7_1_ =
         isTrilinearAnyCompareValid
                   (compareMode,prec,depths0,depths1,cmpReference,result,isFixedPointDepth);
  }
  else {
    prec_local._7_1_ =
         isTrilinearPCFCompareValid
                   (compareMode,prec,depths0,depths1,xBounds0,yBounds0,xBounds1,yBounds1,fBounds,
                    cmpReference,result,isFixedPointDepth);
  }
  return prec_local._7_1_;
}

Assistant:

static bool isTrilinearCompareValid (const Sampler::CompareMode	compareMode,
									 const TexComparePrecision&	prec,
									 const Vec4&				depths0,
									 const Vec4&				depths1,
									 const Vec2&				xBounds0,
									 const Vec2&				yBounds0,
									 const Vec2&				xBounds1,
									 const Vec2&				yBounds1,
									 const Vec2&				fBounds,
									 const float				cmpReference,
									 const float				result,
									 const bool					isFixedPointDepth)
{
	if (prec.pcfBits > 0)
		return isTrilinearPCFCompareValid(compareMode, prec, depths0, depths1, xBounds0, yBounds0, xBounds1, yBounds1, fBounds, cmpReference, result, isFixedPointDepth);
	else
		return isTrilinearAnyCompareValid(compareMode, prec, depths0, depths1, cmpReference, result, isFixedPointDepth);
}